

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O2

void __thiscall DynamicGraph::deleteEdge(DynamicGraph *this,Vertex *v,Vertex *u)

{
  edge_desc_impl<boost::undirected_tag,_unsigned_long> e_00;
  Edge e_01;
  invalid_argument *this_00;
  code *pcVar1;
  undefined *puVar2;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  Edge e;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_40;
  
  if (this->isInitialized == false) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)this_00,"Dynamic Graph not initialized!");
    puVar2 = &std::runtime_error::typeinfo;
    pcVar1 = std::runtime_error::~runtime_error;
  }
  else {
    boost::
    edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
              (&local_40,(boost *)*v,*u,(vertex_descriptor)this,in_R8);
    if (local_40.second != false) {
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_40,(boost *)*v,*u,(vertex_descriptor)this,in_R8);
      e_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
           local_40.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      e_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
           local_40.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      e_00.m_eproperty = local_40.first.m_eproperty;
      boost::detail::remove_undirected_edge_dispatch<boost::no_property>::
      apply<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>
                (e_00,(undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>
                       *)this,(no_property *)local_40.first.m_eproperty);
      e_01.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
           local_40.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      e_01.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
           local_40.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      e_01.m_eproperty = local_40.first.m_eproperty;
      handleDeletion(this,e_01);
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Edge does not exist");
    puVar2 = &std::invalid_argument::typeinfo;
    pcVar1 = std::invalid_argument::~invalid_argument;
  }
  __cxa_throw(this_00,puVar2,pcVar1);
}

Assistant:

void DynamicGraph::deleteEdge(const Vertex &v, const Vertex &u)
{
    if(!this->isInitialized) {
        throw std::runtime_error("Dynamic Graph not initialized!");
    }

    bool edgeExist = edge(v,u,*this).second;
    if (!edgeExist) {
        throw std::invalid_argument("Edge does not exist");
    }
    Edge e = edge(v,u,*this).first;
    boost::remove_edge(e, *this);
    this->handleDeletion(e);
}